

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void POOL_free(POOL_ctx *ctx)

{
  POOL_ctx *ctx_local;
  
  if (ctx != (POOL_ctx *)0x0) {
    POOL_join(ctx);
    pthread_mutex_destroy((pthread_mutex_t *)&ctx->queueMutex);
    pthread_cond_destroy((pthread_cond_t *)&ctx->queuePushCond);
    pthread_cond_destroy((pthread_cond_t *)&ctx->queuePopCond);
    ZSTD_free(ctx->queue,ctx->customMem);
    ZSTD_free(ctx->threads,ctx->customMem);
    ZSTD_free(ctx,ctx->customMem);
  }
  return;
}

Assistant:

void POOL_free(POOL_ctx *ctx) {
    if (!ctx) { return; }
    POOL_join(ctx);
    ZSTD_pthread_mutex_destroy(&ctx->queueMutex);
    ZSTD_pthread_cond_destroy(&ctx->queuePushCond);
    ZSTD_pthread_cond_destroy(&ctx->queuePopCond);
    ZSTD_free(ctx->queue, ctx->customMem);
    ZSTD_free(ctx->threads, ctx->customMem);
    ZSTD_free(ctx, ctx->customMem);
}